

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O1

riff * riff_parse(DUMBFILE *f,int32 offset,int32 size,uint proper)

{
  riff_chunk *prVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  riff *stream;
  riff_chunk *prVar8;
  riff *prVar9;
  
  if (7 < size) {
    iVar3 = dumbfile_seek(f,(long)offset,0);
    if (iVar3 != 0) {
      return (riff *)0x0;
    }
    iVar4 = dumbfile_mgetl(f);
    if (((iVar4 == 0x52494646) && (uVar5 = dumbfile_igetl(f), 3 < uVar5 && uVar5 + 8 <= (uint)size))
       && (stream = (riff *)malloc(0x10), stream != (riff *)0x0)) {
      uVar6 = dumbfile_mgetl(f);
      stream->type = uVar6;
      stream->chunk_count = 0;
      stream->chunks = (riff_chunk *)0x0;
      uVar5 = uVar5 - 4;
      do {
        if (uVar5 == 0) {
          uVar5 = 0;
          break;
        }
        iVar3 = dumbfile_error(f);
        if (iVar3 != 0) {
          uVar5 = 1;
          break;
        }
        if (uVar5 < 8) {
LAB_006f7ab0:
          bVar2 = false;
        }
        else {
          prVar8 = (riff_chunk *)realloc(stream->chunks,(ulong)(stream->chunk_count + 1) * 0x18);
          stream->chunks = prVar8;
          if (prVar8 == (riff_chunk *)0x0) goto LAB_006f7ab0;
          uVar6 = stream->chunk_count;
          uVar7 = dumbfile_mgetl(f);
          prVar8[uVar6].type = uVar7;
          uVar7 = dumbfile_igetl(f);
          prVar8[uVar6].size = uVar7;
          iVar4 = dumbfile_pos(f);
          prVar8[uVar6].offset = iVar4;
          uVar5 = uVar5 - 8;
          if (uVar5 < prVar8[uVar6].size) goto LAB_006f7ab0;
          prVar1 = prVar8 + uVar6;
          if (prVar1->type == 0x52494646) {
            prVar9 = riff_parse(f,iVar4 + -8,prVar8[uVar6].size + 8,proper);
            prVar1->nested = prVar9;
            if (prVar9 == (riff *)0x0) goto LAB_006f7ab0;
          }
          else {
            prVar1->nested = (riff *)0x0;
          }
          dumbfile_seek(f,(ulong)(prVar1->size + prVar1->offset),0);
          uVar5 = uVar5 - prVar1->size;
          if ((proper != 0) && ((prVar1->size & 1) != 0)) {
            dumbfile_skip(f,1);
            uVar5 = uVar5 - 1;
          }
          stream->chunk_count = stream->chunk_count + 1;
          bVar2 = true;
        }
      } while (bVar2);
      if (uVar5 == 0) {
        return stream;
      }
      riff_free(stream);
    }
  }
  return (riff *)0x0;
}

Assistant:

struct riff * riff_parse( DUMBFILE * f, int32 offset, int32 size, unsigned proper )
{
	unsigned stream_size;
	struct riff * stream;


    if ( size < 8 ) return 0;

    if ( dumbfile_seek(f, offset, DFS_SEEK_SET) ) return 0;
    if ( dumbfile_mgetl(f) != DUMB_ID('R','I','F','F') ) return 0;

    stream_size = dumbfile_igetl(f);
    if ( stream_size + 8 > (unsigned)size ) return 0;
	if ( stream_size < 4 ) return 0;

    stream = (struct riff *) malloc( sizeof( struct riff ) );
	if ( ! stream ) return 0;

    stream->type = dumbfile_mgetl(f);
	stream->chunk_count = 0;
	stream->chunks = 0;

	stream_size -= 4;

    while ( stream_size && !dumbfile_error(f) )
	{
		struct riff_chunk * chunk;
		if ( stream_size < 8 ) break;
        stream->chunks = ( struct riff_chunk * ) realloc( stream->chunks, ( stream->chunk_count + 1 ) * sizeof( struct riff_chunk ) );
		if ( ! stream->chunks ) break;
		chunk = stream->chunks + stream->chunk_count;
        chunk->type = dumbfile_mgetl(f);
        chunk->size = dumbfile_igetl(f);
        chunk->offset = dumbfile_pos(f);
		stream_size -= 8;
		if ( stream_size < chunk->size ) break;
        if ( chunk->type == DUMB_ID('R','I','F','F') )
		{
            chunk->nested = riff_parse( f, chunk->offset - 8, chunk->size + 8, proper );
            if ( ! chunk->nested ) break;
		}
		else
		{
            chunk->nested = 0;
		}
        dumbfile_seek(f, chunk->offset + chunk->size, DFS_SEEK_SET);
		stream_size -= chunk->size;
		if ( proper && ( chunk->size & 1 ) )
		{
            dumbfile_skip(f, 1);
			-- stream_size;
		}
		++stream->chunk_count;
	}
	
	if ( stream_size )
	{
		riff_free( stream );
		stream = 0;
	}

	return stream;
}